

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_shiftd_rm_T1(DisasContext *s,MemOp ot,int op1,_Bool is_right,TCGv_i64 count_in)

{
  TCGContext *tcg_ctx_00;
  int iVar1;
  long arg2;
  TCGv_i64 ret;
  TCGv_i64 count;
  target_ulong mask;
  TCGContext *tcg_ctx;
  TCGv_i64 count_in_local;
  _Bool is_right_local;
  int op1_local;
  MemOp ot_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = 0x1f;
  if (ot == MO_64) {
    iVar1 = 0x3f;
  }
  arg2 = (long)iVar1;
  if (op1 == 0x10) {
    gen_op_ld_v(s,ot,s->T0,s->A0);
  }
  else {
    gen_op_mov_v_reg(s,ot,s->T0,op1);
  }
  ret = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_andi_i64_x86_64(tcg_ctx_00,ret,count_in,arg2);
  if (ot == MO_16) {
    if (is_right) {
      tcg_gen_deposit_i64_x86_64(tcg_ctx_00,s->tmp0,s->T0,s->T1,0x10,0x10);
      tcg_gen_mov_i64_x86_64(tcg_ctx_00,s->T1,s->T0);
      tcg_gen_mov_i64_x86_64(tcg_ctx_00,s->T0,s->tmp0);
    }
    else {
      tcg_gen_deposit_i64_x86_64(tcg_ctx_00,s->T1,s->T0,s->T1,0x10,0x10);
    }
  }
  else if (ot != MO_32) {
    tcg_gen_subi_i64_x86_64(tcg_ctx_00,s->tmp0,ret,1);
    if (is_right) {
      tcg_gen_shr_i64_x86_64(tcg_ctx_00,s->tmp0,s->T0,s->tmp0);
      tcg_gen_subfi_i64_x86_64(tcg_ctx_00,s->tmp4,arg2 + 1,ret);
      tcg_gen_shr_i64_x86_64(tcg_ctx_00,s->T0,s->T0,ret);
      tcg_gen_shl_i64_x86_64(tcg_ctx_00,s->T1,s->T1,s->tmp4);
    }
    else {
      tcg_gen_shl_i64_x86_64(tcg_ctx_00,s->tmp0,s->T0,s->tmp0);
      if (ot == MO_16) {
        tcg_gen_subfi_i64_x86_64(tcg_ctx_00,s->tmp4,0x21,ret);
        tcg_gen_shr_i64_x86_64(tcg_ctx_00,s->tmp4,s->T1,s->tmp4);
        tcg_gen_or_i64_x86_64(tcg_ctx_00,s->tmp0,s->tmp0,s->tmp4);
      }
      tcg_gen_subfi_i64_x86_64(tcg_ctx_00,s->tmp4,arg2 + 1,ret);
      tcg_gen_shl_i64_x86_64(tcg_ctx_00,s->T0,s->T0,ret);
      tcg_gen_shr_i64_x86_64(tcg_ctx_00,s->T1,s->T1,s->tmp4);
    }
    tcg_gen_movi_i64_x86_64(tcg_ctx_00,s->tmp4,0);
    tcg_gen_movcond_i64_x86_64(tcg_ctx_00,TCG_COND_EQ,s->T1,ret,s->tmp4,s->tmp4,s->T1);
    tcg_gen_or_i64_x86_64(tcg_ctx_00,s->T0,s->T0,s->T1);
    goto LAB_00554616;
  }
  tcg_gen_subi_i64_x86_64(tcg_ctx_00,s->tmp0,ret,1);
  if (is_right) {
    tcg_gen_concat32_i64(tcg_ctx_00,s->T0,s->T0,s->T1);
    tcg_gen_shr_i64_x86_64(tcg_ctx_00,s->tmp0,s->T0,s->tmp0);
    tcg_gen_shr_i64_x86_64(tcg_ctx_00,s->T0,s->T0,ret);
  }
  else {
    tcg_gen_concat32_i64(tcg_ctx_00,s->T0,s->T1,s->T0);
    tcg_gen_shl_i64_x86_64(tcg_ctx_00,s->tmp0,s->T0,s->tmp0);
    tcg_gen_shl_i64_x86_64(tcg_ctx_00,s->T0,s->T0,ret);
    tcg_gen_shri_i64_x86_64(tcg_ctx_00,s->tmp0,s->tmp0,0x20);
    tcg_gen_shri_i64_x86_64(tcg_ctx_00,s->T0,s->T0,0x20);
  }
LAB_00554616:
  gen_op_st_rm_T0_A0(s,ot,op1);
  gen_shift_flags(s,ot,s->T0,s->tmp0,ret,is_right);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_shiftd_rm_T1(DisasContext *s, MemOp ot, int op1,
                             bool is_right, TCGv count_in)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    target_ulong mask = (ot == MO_64 ? 63 : 31);
    TCGv count;

    /* load */
    if (op1 == OR_TMP0) {
        gen_op_ld_v(s, ot, s->T0, s->A0);
    } else {
        gen_op_mov_v_reg(s, ot, s->T0, op1);
    }

    count = tcg_temp_new(tcg_ctx);
    tcg_gen_andi_tl(tcg_ctx, count, count_in, mask);

    switch (ot) {
    case MO_16:
        /* Note: we implement the Intel behaviour for shift count > 16.
           This means "shrdw C, B, A" shifts A:B:A >> C.  Build the B:A
           portion by constructing it as a 32-bit value.  */
        if (is_right) {
            tcg_gen_deposit_tl(tcg_ctx, s->tmp0, s->T0, s->T1, 16, 16);
            tcg_gen_mov_tl(tcg_ctx, s->T1, s->T0);
            tcg_gen_mov_tl(tcg_ctx, s->T0, s->tmp0);
        } else {
            tcg_gen_deposit_tl(tcg_ctx, s->T1, s->T0, s->T1, 16, 16);
        }
        /* FALLTHRU */
#ifdef TARGET_X86_64
    case MO_32:
        /* Concatenate the two 32-bit values and use a 64-bit shift.  */
        tcg_gen_subi_tl(tcg_ctx, s->tmp0, count, 1);
        if (is_right) {
            tcg_gen_concat_tl_i64(tcg_ctx, s->T0, s->T0, s->T1);
            tcg_gen_shr_i64(tcg_ctx, s->tmp0, s->T0, s->tmp0);
            tcg_gen_shr_i64(tcg_ctx, s->T0, s->T0, count);
        } else {
            tcg_gen_concat_tl_i64(tcg_ctx, s->T0, s->T1, s->T0);
            tcg_gen_shl_i64(tcg_ctx, s->tmp0, s->T0, s->tmp0);
            tcg_gen_shl_i64(tcg_ctx, s->T0, s->T0, count);
            tcg_gen_shri_i64(tcg_ctx, s->tmp0, s->tmp0, 32);
            tcg_gen_shri_i64(tcg_ctx, s->T0, s->T0, 32);
        }
        break;
#endif
    default:
        tcg_gen_subi_tl(tcg_ctx, s->tmp0, count, 1);
        if (is_right) {
            tcg_gen_shr_tl(tcg_ctx, s->tmp0, s->T0, s->tmp0);

            tcg_gen_subfi_tl(tcg_ctx, s->tmp4, mask + 1, count);
            tcg_gen_shr_tl(tcg_ctx, s->T0, s->T0, count);
            tcg_gen_shl_tl(tcg_ctx, s->T1, s->T1, s->tmp4);
        } else {
            tcg_gen_shl_tl(tcg_ctx, s->tmp0, s->T0, s->tmp0);
            if (ot == MO_16) {
                /* Only needed if count > 16, for Intel behaviour.  */
                tcg_gen_subfi_tl(tcg_ctx, s->tmp4, 33, count);
                tcg_gen_shr_tl(tcg_ctx, s->tmp4, s->T1, s->tmp4);
                tcg_gen_or_tl(tcg_ctx, s->tmp0, s->tmp0, s->tmp4);
            }

            tcg_gen_subfi_tl(tcg_ctx, s->tmp4, mask + 1, count);
            tcg_gen_shl_tl(tcg_ctx, s->T0, s->T0, count);
            tcg_gen_shr_tl(tcg_ctx, s->T1, s->T1, s->tmp4);
        }
        tcg_gen_movi_tl(tcg_ctx, s->tmp4, 0);
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s->T1, count, s->tmp4,
                           s->tmp4, s->T1);
        tcg_gen_or_tl(tcg_ctx, s->T0, s->T0, s->T1);
        break;
    }

    /* store */
    gen_op_st_rm_T0_A0(s, ot, op1);

    gen_shift_flags(s, ot, s->T0, s->tmp0, count, is_right);
    tcg_temp_free(tcg_ctx, count);
}